

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void mocker::ir::printFunc(FunctionModule *func,ostream *out)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  char *pcVar3;
  shared_ptr<mocker::ir::IRInst> *inst;
  long lVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer pbVar7;
  size_t i;
  ulong uVar8;
  string attachedComment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  allocator<char> local_c1;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  poVar2 = std::operator<<(out,"define ");
  poVar2 = std::operator<<(poVar2,(string *)func);
  std::operator<<(poVar2," ( ");
  lVar4 = 0;
  for (uVar8 = 0;
      pbVar7 = (func->args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(func->args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5);
      uVar8 = uVar8 + 1) {
    if (uVar8 != 0) {
      std::operator<<(out," ");
      pbVar7 = (func->args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::operator<<(out,(string *)((long)&(pbVar7->_M_dataplus)._M_p + lVar4));
    lVar4 = lVar4 + 0x20;
  }
  std::operator<<(out," )");
  if (func->isExternal == true) {
    std::operator<<(out," external\n");
  }
  else {
    std::operator<<(out," {\n");
    local_c0 = (_List_node_base *)&func->bbs;
    p_Var5 = local_c0;
    while (p_Var1 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *
                      )&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != local_c0) {
      poVar2 = std::operator<<(out,"<");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,">:\n");
      p_Var6 = (_List_node_base *)&p_Var1[1]._M_prev;
      local_b8 = p_Var1;
      while (p_Var6 = p_Var6->_M_next, p_Var5 = local_b8,
            p_Var6 != (_List_node_base *)&p_Var1[1]._M_prev) {
        dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&local_90,(shared_ptr<mocker::ir::IRInst> *)(p_Var6 + 1));
        if (local_90._M_dataplus._M_p == (pointer)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
          fmtInst_abi_cxx11_(&local_50,(ir *)(p_Var6 + 1),inst);
          if (local_b0._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_c1);
          }
          else {
            std::operator+(&local_70,"  ; ",&local_b0);
          }
          std::operator+(&local_90,&local_50,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          local_b0._M_string_length = 0;
          *local_b0._M_dataplus._M_p = '\0';
          pcVar3 = (char *)std::__cxx11::string::at((ulong)&local_90);
          if (*pcVar3 != ';') {
            std::operator<<(out,"  ");
          }
          poVar2 = std::operator<<(out,(string *)&local_90);
          std::operator<<(poVar2,"\n");
          std::__cxx11::string::~string((string *)&local_90);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
        }
      }
    }
    poVar2 = std::operator<<(out,"}");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void printFunc(const FunctionModule &func, std::ostream &out) {
  std::string attachedComment;

  out << "define " << func.getIdentifier() << " ( ";
  for (std::size_t i = 0; i < func.getArgs().size(); ++i) {
    if (i != 0)
      out << " ";
    out << func.getArgs()[i];
  }
  out << " )";
  if (func.isExternalFunc()) {
    out << " external\n";
    return;
  }
  out << " {\n";
  for (const auto &bb : func.getBBs()) {
    out << "<" << bb.getLabelID() << ">:\n";
    for (const auto &inst : bb.getInsts()) {
      if (auto p = dyc<AttachedComment>(inst)) {
        attachedComment = p->getContent();
        continue;
      }

      auto str = fmtInst(inst) +
                 (attachedComment.empty() ? "" : "  ; " + attachedComment);
      attachedComment.clear();
      if (str.at(0) != ';')
        out << "  ";
      out << str << "\n";
    }
  }
  out << "}" << std::endl;
}